

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypesHierarchy.cpp
# Opt level: O2

TYPE_ID __thiscall
TypesHierarchy::AddCompisite
          (TypesHierarchy *this,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *tmptypes)

{
  pointer pvVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  _Self __tmp;
  long lVar4;
  uint uVar5;
  size_t i;
  ulong uVar6;
  undefined1 auStack_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmprow;
  
  tmprow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_48 = (undefined1  [8])0x0;
  tmprow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  for (p_Var3 = (tmptypes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(tmptypes->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_48,&p_Var3[1]._M_color
              );
  }
  uVar6 = (ulong)this->CompositeStartFrom;
  if (uVar6 != 0) {
    lVar4 = uVar6 * 0x18;
    for (; pvVar1 = (this->types).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        uVar6 <= (ulong)(((long)(this->types).
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18);
        uVar6 = uVar6 + 1) {
      bVar2 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              ((long)&(pvVar1->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data + lVar4),
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_48);
      if (bVar2) goto LAB_0013eade;
      lVar4 = lVar4 + 0x18;
    }
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back(&this->types,(value_type *)auStack_48);
  uVar5 = (int)(((long)(this->types).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->types).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) - 1;
  uVar6 = (ulong)uVar5;
  if (this->CompositeStartFrom == 0) {
    this->CompositeStartFrom = uVar5;
  }
LAB_0013eade:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_48);
  return (TYPE_ID)uVar6;
}

Assistant:

TYPE_ID TypesHierarchy::AddCompisite(set<TYPE_ID>* tmptypes) {
	TYPE_ID newType;
	set <TYPE_ID>::iterator it_type;
	vector<TYPE_ID> tmprow;

	for ( it_type = tmptypes->begin(); it_type != tmptypes->end(); it_type++)
		tmprow.push_back(*it_type);


	if (CompositeStartFrom != 0)
		for ( size_t i = CompositeStartFrom; i <= types.size(); i++)
			if( types[i] == tmprow ) return i;


	types.push_back(tmprow);
	newType = types.size()-1;

	if (CompositeStartFrom == 0) CompositeStartFrom = newType;
	return newType;
}